

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_extcomplex_node
              (lys_ext_instance_complex *ext,char *parent_name,char *node_name,lys_node *node,
              LY_STMT stmt)

{
  LY_STMT LVar1;
  LY_STMT LVar2;
  void *pvVar3;
  lys_node *local_50;
  lys_node *siter;
  lys_node **snode;
  lyext_substmt *info;
  lys_node *plStack_30;
  LY_STMT stmt_local;
  lys_node *node_local;
  char *node_name_local;
  char *parent_name_local;
  lys_ext_instance_complex *ext_local;
  
  info._4_4_ = stmt;
  plStack_30 = node;
  node_local = (lys_node *)node_name;
  node_name_local = parent_name;
  parent_name_local = (char *)ext;
  pvVar3 = lys_ext_complex_get_substmt(stmt,ext,(lyext_substmt **)&snode);
  if (pvVar3 == (void *)0x0) {
    ly_vlog(LYE_INCHILDSTMT,LY_VLOG_NONE,(void *)0x0,node_local,node_name_local);
    ext_local._4_4_ = 1;
  }
  else {
    if (*(uint *)(snode + 2) < 2) {
      for (local_50 = plStack_30; LVar1 = info._4_4_, local_50 != (lys_node *)0x0;
          local_50 = local_50->next) {
        LVar2 = lys_snode2stmt(local_50->nodetype);
        if (LVar1 == LVar2) {
          ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,node_local,node_name_local);
          return 1;
        }
      }
    }
    ext_local._4_4_ = 0;
  }
  return ext_local._4_4_;
}

Assistant:

int
yang_extcomplex_node(struct lys_ext_instance_complex *ext, char *parent_name, char *node_name,
                     struct lys_node *node, LY_STMT stmt)
{
    struct lyext_substmt *info;
    struct lys_node **snode, *siter;

    snode = lys_ext_complex_get_substmt(stmt, ext, &info);
    if (!snode) {
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_NONE, NULL, node_name, parent_name);
        return EXIT_FAILURE;
    }
    if (info->cardinality < LY_STMT_CARD_SOME) {
        LY_TREE_FOR(node, siter) {
            if (stmt == lys_snode2stmt(siter->nodetype)) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, node_name, parent_name);
                return EXIT_FAILURE;
            }
        }
    }

    return EXIT_SUCCESS;
}